

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O3

Image * Image_Function::ConvertTo8Bit(Image *__return_storage_ptr__,Image16Bit *in)

{
  ImageTemplate<unsigned_char> local_40;
  
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_40,0,0,'\x01','\x01');
  PenguinV_Image::ImageTemplate<unsigned_char>::generate
            (__return_storage_ptr__,&local_40,in->_width,in->_height,in->_colorCount,'\x01');
  local_40._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_0011ac30;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_40);
  ConvertTo8Bit(in,0,0,__return_storage_ptr__,0,0,in->_width,in->_height);
  return __return_storage_ptr__;
}

Assistant:

Image ConvertTo8Bit( const Image16Bit & in )
    {
        Image out = Image().generate( in.width(), in.height(), in.colorCount() );
        ConvertTo8Bit( in, 0, 0, out, 0, 0, in.width(), in.height() );

        return out;
    }